

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O3

void messagesender_send_cancel_handler(ASYNC_OPERATION_HANDLE send_operation)

{
  MESSAGE_SENDER_INSTANCE *message_sender;
  
  message_sender = (MESSAGE_SENDER_INSTANCE *)send_operation[4].async_operation_cancel_handler;
  if (send_operation[2].async_operation_cancel_handler != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0)
  {
    (*send_operation[2].async_operation_cancel_handler)
              ((ASYNC_OPERATION_HANDLE)send_operation[3].async_operation_cancel_handler);
  }
  if ((ASYNC_OPERATION_HANDLE)send_operation[7].async_operation_cancel_handler !=
      (ASYNC_OPERATION_HANDLE)0x0) {
    async_operation_cancel((ASYNC_OPERATION_HANDLE)send_operation[7].async_operation_cancel_handler)
    ;
  }
  remove_pending_message(message_sender,send_operation);
  return;
}

Assistant:

static void messagesender_send_cancel_handler(ASYNC_OPERATION_HANDLE send_operation)
{
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, send_operation);
    MESSAGE_SENDER_HANDLE messager_sender = message_with_callback->message_sender;

    if (message_with_callback->on_message_send_complete != NULL)
    {
        message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_CANCELLED, NULL);
    }

    if (message_with_callback->transfer_async_operation != NULL)
    {
        async_operation_cancel(message_with_callback->transfer_async_operation);
    }

    remove_pending_message(messager_sender, send_operation);
}